

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxRawSocket.cpp
# Opt level: O1

void __thiscall LinuxRawSocket::~LinuxRawSocket(LinuxRawSocket *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int in_ESI;
  
  (this->super_SocketImpl)._vptr_SocketImpl = (_func_int **)&PTR__LinuxRawSocket_0010cc88;
  PosixSocketCommon::shutdown(this->socket_fd,in_ESI);
  pcVar2 = (this->output_interface_name)._M_dataplus._M_p;
  paVar1 = &(this->output_interface_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->input_interface_name)._M_dataplus._M_p;
  paVar1 = &(this->input_interface_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  SocketImpl::~SocketImpl(&this->super_SocketImpl);
  return;
}

Assistant:

LinuxRawSocket::~LinuxRawSocket()
{
    PosixSocketCommon::shutdown(socket_fd);
}